

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cones.h
# Opt level: O0

bool __thiscall
mp::
Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::AddRotatedQC(Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               *this,QuadTerms *qpterms,LinTerms *lint,double rhs,int iDiffVars)

{
  int iVar1;
  size_t sVar2;
  reference pvVar3;
  reference pvVar4;
  int in_ECX;
  MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RDI;
  double in_XMM0_Qa;
  double dVar5;
  NodeRange NVar6;
  int i;
  size_t iPush;
  vector<double,_std::allocator<double>_> c;
  vector<int,_std::allocator<int>_> x;
  bool rhsNon0;
  size_t in_stack_fffffffffffffda8;
  vector<double,_std::allocator<double>_> *pvVar7;
  QuadTerms *in_stack_fffffffffffffdb0;
  CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::RotatedQuadraticConeId>
  *this_00;
  allocator_type *in_stack_fffffffffffffdc0;
  size_type in_stack_fffffffffffffdc8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdd0;
  CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::RotatedQuadraticConeId>
  *in_stack_fffffffffffffdd8;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  NodeIndexRange in_stack_fffffffffffffdf8;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffe00;
  undefined1 local_128 [48];
  vector<double,_std::allocator<double>_> local_f8 [3];
  NodeRange local_a8;
  int local_94;
  NodeRange local_90;
  long local_80;
  vector<double,_std::allocator<double>_> local_70 [2];
  vector<int,_std::allocator<int>_> local_40;
  byte local_25;
  int local_24;
  double local_20;
  
  local_25 = ABS(in_XMM0_Qa) != 0.0;
  local_24 = in_ECX;
  local_20 = in_XMM0_Qa;
  QuadTerms::size((QuadTerms *)0x4356d6);
  LinTerms::size((LinTerms *)0x4356eb);
  std::allocator<int>::allocator((allocator<int> *)0x435723);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdd0,
             in_stack_fffffffffffffdc8,(allocator_type *)in_stack_fffffffffffffdc0);
  std::allocator<int>::~allocator((allocator<int> *)0x43574f);
  QuadTerms::size((QuadTerms *)0x43575c);
  LinTerms::size((LinTerms *)0x435771);
  std::allocator<double>::allocator((allocator<double> *)0x4357a9);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  std::allocator<double>::~allocator((allocator<double> *)0x4357d5);
  local_80 = 1;
  sVar2 = LinTerms::size((LinTerms *)0x4357ee);
  if (sVar2 != 0) {
    iVar1 = LinTerms::var((LinTerms *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,0);
    *pvVar3 = iVar1;
    MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::MC(in_RDI);
    local_90 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               ::MakeFixedVar(in_stack_fffffffffffffe00,(double)in_stack_fffffffffffffdf8);
    iVar1 = pre::NodeRange::operator_cast_to_int((NodeRange *)0x435888);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,1);
    *pvVar3 = iVar1;
    dVar5 = LinTerms::coef((LinTerms *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_70,0);
    *pvVar4 = ABS(dVar5) / 2.0;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_70,1);
    *pvVar4 = 1.0;
  }
  local_94 = 0;
  while( true ) {
    iVar1 = local_94;
    sVar2 = QuadTerms::size((QuadTerms *)0x4359ba);
    NVar6.ir_ = in_stack_fffffffffffffdf8;
    NVar6.pvn_ = (ValueNode *)in_stack_fffffffffffffe00;
    if ((int)sVar2 <= iVar1) break;
    if (local_94 == local_24) {
      iVar1 = QuadTerms::var1(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,0);
      *pvVar3 = iVar1;
      iVar1 = QuadTerms::var2(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,1);
      *pvVar3 = iVar1;
      dVar5 = QuadTerms::coef(in_stack_fffffffffffffdb0,(int)(in_stack_fffffffffffffda8 >> 0x20));
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_70,0);
      *pvVar4 = ABS(dVar5);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_70,1);
      *pvVar4 = 0.5;
    }
    else {
      local_80 = local_80 + 1;
      iVar1 = QuadTerms::var1(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      pvVar3 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
                          in_stack_fffffffffffffda8);
      *pvVar3 = iVar1;
      dVar5 = QuadTerms::coef(in_stack_fffffffffffffdb0,(int)(in_stack_fffffffffffffda8 >> 0x20));
      dVar5 = sqrt(ABS(dVar5));
      pvVar4 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdb0,
                          in_stack_fffffffffffffda8);
      *pvVar4 = dVar5;
    }
    local_94 = local_94 + 1;
  }
  if ((local_25 & 1) != 0) {
    local_80 = local_80 + 1;
    MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::MC(in_RDI);
    NVar6 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::MakeFixedVar(in_stack_fffffffffffffe00,(double)in_stack_fffffffffffffdf8);
    local_a8 = NVar6;
    in_stack_fffffffffffffdf4 = pre::NodeRange::operator_cast_to_int((NodeRange *)0x435c17);
    pvVar3 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
                        in_stack_fffffffffffffda8);
    *pvVar3 = in_stack_fffffffffffffdf4;
    in_stack_fffffffffffffdd8 =
         (CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::RotatedQuadraticConeId>
          *)sqrt(ABS(local_20));
    in_stack_fffffffffffffde0 =
         (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          *)std::vector<double,_std::allocator<double>_>::at
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdb0,
                       in_stack_fffffffffffffda8);
    (in_stack_fffffffffffffde0->super_FlatModel<mp::DefaultFlatModelParams>).super_BasicFlatModel.
    _vptr_BasicFlatModel = (_func_int **)in_stack_fffffffffffffdd8;
  }
  MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::MC(in_RDI);
  pvVar7 = (vector<double,_std::allocator<double>_> *)(local_128 + 0x18);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
             (vector<int,_std::allocator<int>_> *)pvVar7);
  this_00 = (CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::RotatedQuadraticConeId>
             *)local_128;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)this_00,pvVar7);
  pvVar7 = local_f8;
  CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::RotatedQuadraticConeId>
  ::CustomStaticConstraint
            ((CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::RotatedQuadraticConeId>
              *)NVar6.pvn_,(Arguments *)NVar6.ir_,
             (Parameters *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::
  AddConstraint<mp::CustomStaticConstraint<std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,mp::RotatedQuadraticConeId>>
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::RotatedQuadraticConeId>
  ::~CustomStaticConstraint(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(pvVar7);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)pvVar7);
  std::vector<double,_std::allocator<double>_>::~vector(pvVar7);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)pvVar7);
  return true;
}

Assistant:

bool AddRotatedQC(const QuadTerms& qpterms,
                    const LinTerms& lint,
                    double rhs, int iDiffVars) {
    assert(lint.size() + (iDiffVars>=0) <= 1);
    const auto rhsNon0 = (std::fabs(rhs)!=0.0);
    std::vector<int> x(qpterms.size()+1+lint.size()+rhsNon0);
    std::vector<double> c(qpterms.size()+1+lint.size()+rhsNon0);
    size_t iPush=1;
    if (lint.size()) {
      x[0] = lint.var(0);
      x[1] = int( MC().MakeFixedVar( 1.0 ) );
      c[0] = std::fabs(lint.coef(0)) / 2.0;
      c[1] = 1.0;      // it's 2xy >= z^2 + ...
    }
    for (int i=0; i<(int)qpterms.size(); ++i) {
      if (i==iDiffVars) {
        x[0] = qpterms.var1(i);
        x[1] = qpterms.var2(i);
        c[0] = std::fabs(qpterms.coef(i));
        c[1] = 0.5;           // it's 2xy >= z^2 + ...
      } else {
        ++iPush;
        x.at(iPush) = qpterms.var1(i);
        c.at(iPush) = std::sqrt(std::fabs(qpterms.coef(i)));
      }
    }
    if (rhsNon0) {            // Add  ... >= ... + |rhs|
      ++iPush;
      x.at(iPush) = int( MC().MakeFixedVar( 1.0 ) );
      c.at(iPush) = std::sqrt( std::fabs(rhs) );
    }
    assert(iPush == x.size()-1);
    MC().AddConstraint(
          RotatedQuadraticConeConstraint(
            std::move(x), std::move(c)));
    return true;
  }